

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

void SSL_CTX_flush_sessions(SSL_CTX *ctx,long tm)

{
  _LHASH *lh;
  TIMEOUT_PARAM tp;
  SSL_CTX *local_40;
  long local_38;
  _LHASH *local_30;
  code *local_28;
  SSL_CTX **local_20;
  
  lh = *(_LHASH **)&(ctx->stats).sess_connect_good;
  if (lh != (_LHASH *)0x0) {
    local_40 = ctx;
    local_38 = tm;
    local_30 = lh;
    CRYPTO_MUTEX_lock_write((CRYPTO_MUTEX *)&ctx->cert_store);
    local_28 = timeout_doall_arg;
    local_20 = &local_40;
    OPENSSL_lh_doall_arg(lh,lh_SSL_SESSION_call_doall_arg,&local_28);
    CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)&ctx->cert_store);
  }
  return;
}

Assistant:

void SSL_CTX_flush_sessions(SSL_CTX *ctx, uint64_t time) {
  TIMEOUT_PARAM tp;

  tp.ctx = ctx;
  tp.cache = ctx->sessions;
  if (tp.cache == NULL) {
    return;
  }
  tp.time = time;
  MutexWriteLock lock(&ctx->lock);
  lh_SSL_SESSION_doall_arg(tp.cache, timeout_doall_arg, &tp);
}